

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddUtilityCommand(void *arg,char *utilityName,char *command,char *arguments,int all,
                        int numDepends,char **depends,int param_8,char **param_9)

{
  pointer *this;
  char *pcVar1;
  allocator local_159;
  string local_158;
  allocator local_131;
  value_type local_130;
  int local_10c;
  undefined1 local_108 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends2;
  cmCustomCommandLines commandLines;
  value_type local_d0;
  allocator local_a9;
  value_type local_a8;
  allocator local_71;
  undefined1 local_70 [8];
  string expand;
  cmCustomCommandLine commandLine;
  cmMakefile *mf;
  int numDepends_local;
  int all_local;
  char *arguments_local;
  char *command_local;
  char *utilityName_local;
  void *arg_local;
  
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_70,command,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,pcVar1,&local_a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&expand.field_2 + 8),&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if ((arguments != (char *)0x0) && (*arguments != '\0')) {
    std::__cxx11::string::operator=((string *)local_70,arguments);
    pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d0,pcVar1,
               (allocator *)
               ((long)&commandLines.
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&expand.field_2 + 8),&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&commandLines.
                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  this = &depends2.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)this);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)this,
             (value_type *)((long)&expand.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_108);
  for (local_10c = 0; local_10c < numDepends; local_10c = local_10c + 1) {
    std::__cxx11::string::operator=((string *)local_70,depends[local_10c]);
    pcVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,pcVar1,&local_131);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,utilityName,&local_159);
  cmMakefile::AddUtilityCommand
            ((cmMakefile *)arg,&local_158,all == 0,(char *)0x0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_108,
             (cmCustomCommandLines *)
             &depends2.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,true,(char *)0x0,false,false);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_108);
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)
             &depends2.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_70);
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  return;
}

Assistant:

void CCONV cmAddUtilityCommand(void* arg, const char* utilityName,
                               const char* command, const char* arguments,
                               int all, int numDepends, const char** depends,
                               int, const char**)
{
  // Get the makefile instance.  Perform an extra variable expansion
  // now because the API caller expects it.
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  // Construct the command line for the command.
  cmCustomCommandLine commandLine;
  std::string expand = command;
  commandLine.push_back(mf->ExpandVariablesInString(expand));
  if (arguments && arguments[0]) {
    // TODO: Parse arguments!
    expand = arguments;
    commandLine.push_back(mf->ExpandVariablesInString(expand));
  }
  cmCustomCommandLines commandLines;
  commandLines.push_back(commandLine);

  // Accumulate the list of dependencies.
  std::vector<std::string> depends2;
  for (int i = 0; i < numDepends; ++i) {
    expand = depends[i];
    depends2.push_back(mf->ExpandVariablesInString(expand));
  }

  // Pass the call to the makefile instance.
  mf->AddUtilityCommand(utilityName, (all ? false : true), CM_NULLPTR,
                        depends2, commandLines);
}